

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O3

bool wasm::tooCostlyToRunUnconditionally(PassOptions *passOptions,Expression *one,Expression *two)

{
  uint uVar1;
  undefined8 in_RAX;
  uint uVar2;
  bool bVar3;
  uint local_28;
  undefined4 local_24;
  
  local_24 = (undefined4)((ulong)in_RAX >> 0x20);
  if (passOptions->shrinkLevel < 2) {
    uVar1 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                      ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)&local_28,one);
    _local_28 = CONCAT44(local_24,uVar1);
    uVar1 = Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
                      ((Visitor<wasm::CostAnalyzer,_unsigned_int> *)&local_24,two);
    if (uVar1 < local_28) {
      uVar1 = local_28;
    }
    uVar2 = 4;
    if (passOptions->shrinkLevel != 0) {
      if (passOptions->shrinkLevel != 1) {
        handle_unreachable("bad shrink level",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveUnusedBrs.cpp"
                           ,0x73);
      }
      uVar2 = 7;
    }
    bVar3 = uVar2 < uVar1;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool tooCostlyToRunUnconditionally(const PassOptions& passOptions,
                                          Expression* one,
                                          Expression* two) {
  // If we care entirely about code size, just do it for that reason (early
  // exit to avoid work).
  if (passOptions.shrinkLevel >= 2) {
    return false;
  }

  // Consider the cost of executing all the code unconditionally, which adds
  // either the cost of running one or two, so the maximum is the worst case.
  auto max = std::max(CostAnalyzer(one).cost, CostAnalyzer(two).cost);
  return tooCostlyToRunUnconditionally(passOptions, max);
}